

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ActiveProgramCase::iterate(ActiveProgramCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderContext *pRVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar6;
  ScopedLogSection section;
  CallLogWrapper gl;
  ProgramPipeline pipeline;
  ResultCollector result;
  ShaderProgram frgProgram;
  ShaderProgram vtxProgram;
  ScopedLogSection local_318;
  undefined1 local_310 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  string local_2e8;
  CallLogWrapper local_2c8;
  ProgramPipeline local_2b0;
  undefined1 local_2a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  bool local_1d8;
  undefined1 local_1d0 [176];
  undefined1 local_120 [16];
  pointer local_110;
  bool local_108;
  ShaderProgram local_100;
  
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1d0,0,0xac);
  local_120._0_8_ = (pointer)0x0;
  local_120._8_8_ = (pointer)0x0;
  local_110 = (pointer)0x0;
  local_108 = true;
  local_310._0_8_ = &local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,
             "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,"");
  local_2a0._0_4_ = 0;
  local_2a0._8_8_ = &local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2a0 + 8),local_310._0_8_,(char *)(local_310._0_8_ + local_310._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (ulong)(uint)local_2a0._0_4_ * 0x18),(value_type *)(local_2a0 + 8));
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar2,(ProgramSources *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._0_8_ != &local_300) {
    operator_delete((void *)local_310._0_8_,local_300._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_1d0 + 0x90));
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_2a0,0,0xac);
  local_1f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8 = true;
  paVar1 = &local_2e8.field_2;
  local_2e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,
             "#version 310 es\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,"");
  local_310._0_4_ = 1;
  local_310._8_8_ = local_300._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_310 + 8),local_2e8._M_dataplus._M_p,
             local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + (local_310._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_310 + 8));
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1d0,pRVar2,(ProgramSources *)local_2a0);
  if ((char *)local_310._8_8_ != local_300._M_local_buf + 8) {
    operator_delete((void *)local_310._8_8_,local_300._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_210);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  glu::ProgramPipeline::ProgramPipeline(&local_2b0,((this->super_TestCase).m_context)->m_renderCtx);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_2c8,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_310._0_8_ = &local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310," // ERROR: ","");
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_2a0,pTVar3,(string *)local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._0_8_ != &local_300) {
    operator_delete((void *)local_310._0_8_,local_300._M_allocated_capacity + 1);
  }
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_310._0_8_ = &local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"VtxProg","");
  local_2e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Vertex program","");
  tcu::ScopedLogSection::ScopedLogSection(&local_318,pTVar3,(string *)local_310,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._0_8_ != &local_300) {
    operator_delete((void *)local_310._0_8_,local_300._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_100
                 );
  tcu::TestLog::endSection(local_318.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_310._0_8_ = &local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"FrgProg","");
  local_2e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Fragment program","");
  tcu::ScopedLogSection::ScopedLogSection(&local_318,pTVar3,(string *)local_310,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._0_8_ != &local_300) {
    operator_delete((void *)local_310._0_8_,local_300._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_1d0);
  tcu::TestLog::endSection(local_318.m_log);
  if ((local_100.m_program.m_info.linkOk == true) && (local_110._0_1_ != false)) {
    local_2c8.m_enableLog = true;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    glu::CallLogWrapper::glBindProgramPipeline(&local_2c8,local_2b0.m_pipeline);
    glu::CallLogWrapper::glUseProgramStages
              (&local_2c8,local_2b0.m_pipeline,1,local_100.m_program.m_program);
    glu::CallLogWrapper::glUseProgramStages(&local_2c8,local_2b0.m_pipeline,2,local_1d0._152_4_);
    GVar5 = glu::CallLogWrapper::glGetError(&local_2c8);
    glu::checkError(GVar5,"gen pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x7d);
    glu::CallLogWrapper::glBindProgramPipeline(&local_2c8,0);
    GVar5 = glu::CallLogWrapper::glGetError(&local_2c8);
    glu::checkError(GVar5,"unbind pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x7f);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_310._0_8_ = &local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"Initial","");
    local_2e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_318,pTVar3,(string *)local_310,&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._0_8_ != &local_300) {
      operator_delete((void *)local_310._0_8_,local_300._M_allocated_capacity + 1);
    }
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              ((ResultCollector *)local_2a0,&local_2c8,local_2b0.m_pipeline,0x8259,0,
               this->m_verifier);
    tcu::TestLog::endSection(local_318.m_log);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_310._0_8_ = &local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"Set","");
    local_2e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Set","");
    tcu::ScopedLogSection::ScopedLogSection(&local_318,pTVar3,(string *)local_310,&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._0_8_ != &local_300) {
      operator_delete((void *)local_310._0_8_,local_300._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glActiveShaderProgram(&local_2c8,local_2b0.m_pipeline,local_1d0._152_4_);
    GVar5 = glu::CallLogWrapper::glGetError(&local_2c8);
    glu::checkError(GVar5,"gen pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x8a);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              ((ResultCollector *)local_2a0,&local_2c8,local_2b0.m_pipeline,0x8259,local_1d0._152_4_
               ,this->m_verifier);
    tcu::TestLog::endSection(local_318.m_log);
    tcu::ResultCollector::setTestContextResult
              ((ResultCollector *)local_2a0,
               (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_p != local_260) {
      operator_delete(local_270._M_p,(ulong)(local_260[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._8_8_ != &local_288) {
      operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::~CallLogWrapper(&local_2c8);
    glu::ProgramPipeline::~ProgramPipeline(&local_2b0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d0);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_310._0_8_ = &local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"failed to build program","");
  tcu::TestError::TestError(this_00,(string *)local_310);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ActiveProgramCase::IterateResult ActiveProgramCase::iterate (void)
{
	const glu::ShaderProgram	vtxProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource));
	const glu::ShaderProgram	frgProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::FragmentSource(s_fragmentSource));
	const glu::ProgramPipeline	pipeline	(m_context.getRenderContext());
	glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result		(m_testCtx.getLog(), " // ERROR: ");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxProg", "Vertex program");
		m_testCtx.getLog() << vtxProgram;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgProg", "Fragment program");
		m_testCtx.getLog() << frgProgram;
	}

	if (!vtxProgram.isOk() || !frgProgram.isOk())
		throw tcu::TestError("failed to build program");

	gl.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	gl.glBindProgramPipeline(pipeline.getPipeline());
	gl.glUseProgramStages(pipeline.getPipeline(), GL_VERTEX_SHADER_BIT, vtxProgram.getProgram());
	gl.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, frgProgram.getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");
	gl.glBindProgramPipeline(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "unbind pipeline");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_ACTIVE_PROGRAM, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Set", "Set");

		gl.glActiveShaderProgram(pipeline.getPipeline(), frgProgram.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");
		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_ACTIVE_PROGRAM, (int)frgProgram.getProgram(), m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}